

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellCommand.cpp
# Opt level: O0

void __thiscall
llbuild::buildsystem::ShellCommand::executeExternalCommand
          (ShellCommand *this,BuildSystem *system,TaskInterface ti,QueueJobContext *context,
          Optional<std::function<void_(llbuild::basic::ProcessResult)>_> *completionFn)

{
  ShellCommandHandler *pSVar1;
  ProcessAttributes attributes;
  pointer pHVar2;
  bool bVar3;
  function<void_(llbuild::basic::ProcessResult)> local_150;
  Optional<std::function<void_(llbuild::basic::ProcessResult)>_> local_130;
  byte local_108;
  byte bStack_107;
  undefined6 uStack_106;
  undefined8 local_100;
  undefined8 local_f8;
  byte local_f0;
  byte bStack_ef;
  undefined6 uStack_ee;
  ArrayRef<std::pair<llvm::StringRef,_llvm::StringRef>_> local_e8;
  ArrayRef<llvm::StringRef> local_d8;
  byte local_c5;
  uint local_c4;
  undefined1 local_c0 [3];
  bool connectToConsole;
  ShellCommand *local_a0;
  void *local_98;
  undefined1 local_90 [8];
  anon_class_72_4_ab194bda commandCompletionFn;
  Optional<std::function<void_(llbuild::basic::ProcessResult)>_> *completionFn_local;
  QueueJobContext *context_local;
  BuildSystem *system_local;
  ShellCommand *this_local;
  TaskInterface ti_local;
  
  commandCompletionFn.ti.impl = ti.ctx;
  commandCompletionFn.system = (BuildSystem *)ti.impl;
  local_90 = (undefined1  [8])this;
  commandCompletionFn.this = (ShellCommand *)system;
  commandCompletionFn.completionFn.Storage._32_8_ = completionFn;
  this_local = (ShellCommand *)commandCompletionFn.system;
  ti_local.impl = commandCompletionFn.ti.impl;
  llvm::Optional<std::function<void_(llbuild::basic::ProcessResult)>_>::Optional
            ((Optional<std::function<void_(llbuild::basic::ProcessResult)>_> *)
             &commandCompletionFn.ti.ctx,completionFn);
  bVar3 = this->handler == (ShellCommandHandler *)0x0;
  if (bVar3) {
    local_c5 = 0;
    llvm::ArrayRef<llvm::StringRef>::ArrayRef<std::allocator<llvm::StringRef>>
              (&local_d8,&this->args);
    llvm::ArrayRef<std::pair<llvm::StringRef,_llvm::StringRef>_>::ArrayRef<void>
              (&local_e8,
               (SmallVectorTemplateCommon<std::pair<llvm::StringRef,_llvm::StringRef>,_void> *)
               &this->env);
    local_108 = this->canSafelyInterrupt & 1;
    bStack_107 = local_c5 & 1;
    ti_local.ctx = &this->workingDirectory;
    local_100 = std::__cxx11::string::data();
    local_f8 = std::__cxx11::string::length();
    local_f0 = this->inheritEnv & 1;
    bStack_ef = this->controlEnabled & 1;
    std::function<void(llbuild::basic::ProcessResult)>::
    function<llbuild::buildsystem::ShellCommand::executeExternalCommand(llbuild::buildsystem::BuildSystem&,llbuild::core::TaskInterface,llbuild::basic::QueueJobContext*,llvm::Optional<std::function<void(llbuild::basic::ProcessResult)>>)::__0&,void>
              ((function<void(llbuild::basic::ProcessResult)> *)&local_150,
               (anon_class_72_4_ab194bda *)local_90);
    llvm::Optional<std::function<void_(llbuild::basic::ProcessResult)>_>::Optional
              (&local_130,&local_150);
    attributes.connectToConsole = (bool)bStack_107;
    attributes.canSafelyInterrupt = (bool)local_108;
    attributes._2_6_ = uStack_106;
    attributes.controlEnabled = (bool)bStack_ef;
    attributes.inheritEnvironment = (bool)local_f0;
    attributes._26_6_ = uStack_ee;
    attributes.workingDir.Data = (char *)local_100;
    attributes.workingDir.Length = local_f8;
    llbuild::core::TaskInterface::spawn
              ((TaskInterface *)&this_local,context,local_d8,local_e8,attributes,&local_130,
               (ProcessDelegate *)0x0);
    llvm::Optional<std::function<void_(llbuild::basic::ProcessResult)>_>::~Optional(&local_130);
    std::function<void_(llbuild::basic::ProcessResult)>::~function(&local_150);
  }
  else {
    pSVar1 = this->handler;
    pHVar2 = std::
             unique_ptr<llbuild::buildsystem::HandlerState,_std::default_delete<llbuild::buildsystem::HandlerState>_>
             ::get(&this->handlerState);
    local_a0 = this_local;
    local_98 = ti_local.impl;
    std::function<void(llbuild::basic::ProcessResult)>::
    function<llbuild::buildsystem::ShellCommand::executeExternalCommand(llbuild::buildsystem::BuildSystem&,llbuild::core::TaskInterface,llbuild::basic::QueueJobContext*,llvm::Optional<std::function<void(llbuild::basic::ProcessResult)>>)::__0&,void>
              ((function<void(llbuild::basic::ProcessResult)> *)local_c0,
               (anon_class_72_4_ab194bda *)local_90);
    (*pSVar1->_vptr_ShellCommandHandler[3])(pSVar1,pHVar2,this,local_a0,local_98,context,local_c0);
    std::function<void_(llbuild::basic::ProcessResult)>::~function
              ((function<void_(llbuild::basic::ProcessResult)> *)local_c0);
  }
  local_c4 = (uint)!bVar3;
  executeExternalCommand(llbuild::buildsystem::BuildSystem&,llbuild::core::TaskInterface,llbuild::basic::QueueJobContext*,llvm::Optional<std::function<void(llbuild::basic::ProcessResult)>>)
  ::$_0::~__0((__0 *)local_90);
  return;
}

Assistant:

void ShellCommand::executeExternalCommand(
    BuildSystem& system,
    TaskInterface ti,
    QueueJobContext* context,
    llvm::Optional<ProcessCompletionFn> completionFn) {
  auto commandCompletionFn = [this, &system, ti, completionFn](ProcessResult result) mutable {
    if (result.status != ProcessStatus::Succeeded) {
      // If the command failed, there is no need to gather dependencies.
      if (completionFn.hasValue())
        completionFn.getValue()(result);
      return;
    }

    // Collect the discovered dependencies, if used.
    if (!depsPaths.empty()) {
      ti.spawn(QueueJob{ this, [this, &system, ti, completionFn, result](QueueJobContext* context) mutable {
            if (!processDiscoveredDependencies(system, ti, context)) {
              // If we were unable to process the dependencies output, report a
              // failure.
              if (completionFn.hasValue())
                completionFn.getValue()(ProcessStatus::Failed);
              return;
            }
            if (completionFn.hasValue())
              completionFn.getValue()(result);
          }}, QueueJobPriority::High);
      return;
    }

    if (completionFn.hasValue())
      completionFn.getValue()(result);
  };
      
  // Delegate to the handler, if present.
  if (handler) {
    // FIXME: We should consider making this interface capable of feeding
    // back the dependencies directly.
    //
    // FIXME: This needs to honor certain properties of the execution queue
    // (like indicating when the work starts and stops, and communicating with
    // the execution queue delegate controlling how output is handled). It could
    // be the case that this should actually be delegating this work to run on
    // the execution queue, and the queue handles the handoff.
    handler->execute(
        handlerState.get(), this, ti, context, commandCompletionFn);
    return;
  }

  bool connectToConsole = false;

  // Execute the command.
  ti.spawn(
      context, args, env,
      {canSafelyInterrupt, connectToConsole, workingDirectory, inheritEnv, controlEnabled},
      /*completionFn=*/{commandCompletionFn});
}